

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Input::bitSetMatch(Input *this,char *Str,bool param_2)

{
  ulong *puVar1;
  HNode *pHVar2;
  _func_int **pp_Var3;
  _func_int *__n;
  _func_int *__s1;
  int iVar4;
  _func_int *p_Var5;
  char *__function;
  ulong uVar6;
  Node *pNVar7;
  Twine local_58;
  Node *local_40;
  char *local_38;
  
  if ((this->EC)._M_value == 0) {
    pHVar2 = this->CurrentNode;
    if (pHVar2 == (HNode *)0x0) {
      __function = 
      "static bool llvm::isa_impl_cl<llvm::yaml::Input::SequenceHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::SequenceHNode, From = const llvm::yaml::Input::HNode *]"
      ;
LAB_00dacae6:
      __assert_fail("Val && \"isa<> used on a null pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                    ,0x69,__function);
    }
    if (pHVar2->_node->TypeID == 5) {
      pNVar7 = (Node *)pHVar2[1]._vptr_HNode;
      local_40 = pHVar2[1]._node;
      uVar6 = 0;
      local_38 = Str;
      if (pNVar7 == local_40) goto LAB_00dacaa2;
      do {
        pp_Var3 = pNVar7->_vptr_Node;
        if (pp_Var3 == (_func_int **)0x0) {
          __function = 
          "static bool llvm::isa_impl_cl<llvm::yaml::Input::ScalarHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::ScalarHNode, From = const llvm::yaml::Input::HNode *]"
          ;
          goto LAB_00dacae6;
        }
        if (*(int *)(pp_Var3[1] + 0x20) - 3U < 0xfffffffe) {
          pHVar2 = this->CurrentNode;
          Twine::Twine(&local_58,"unexpected scalar in sequence of bit values");
          setError(this,pHVar2,&local_58);
          Str = local_38;
        }
        else {
          __n = pp_Var3[3];
          if (Str == (char *)0x0) {
            if (__n == (_func_int *)0x0) goto LAB_00dacab3;
          }
          else {
            __s1 = pp_Var3[2];
            p_Var5 = (_func_int *)strlen(Str);
            Str = local_38;
            if ((__n == p_Var5) &&
               ((__n == (_func_int *)0x0 ||
                (iVar4 = bcmp(__s1,local_38,(size_t)__n), Str = local_38, iVar4 == 0)))) {
LAB_00dacab3:
              puVar1 = (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (uVar6 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
              uVar6 = 1;
              goto LAB_00dacaa2;
            }
          }
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        pNVar7 = (Node *)&pNVar7->Doc;
      } while (pNVar7 != local_40);
    }
    else {
      Twine::Twine(&local_58,"expected sequence of bit values");
      setError(this,pHVar2,&local_58);
    }
  }
  uVar6 = 0;
LAB_00dacaa2:
  return SUB81(uVar6,0);
}

Assistant:

bool Input::bitSetMatch(const char *Str, bool) {
  if (EC)
    return false;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    unsigned Index = 0;
    for (auto &N : SQ->Entries) {
      if (ScalarHNode *SN = dyn_cast<ScalarHNode>(N.get())) {
        if (SN->value().equals(Str)) {
          BitValuesUsed[Index] = true;
          return true;
        }
      } else {
        setError(CurrentNode, "unexpected scalar in sequence of bit values");
      }
      ++Index;
    }
  } else {
    setError(CurrentNode, "expected sequence of bit values");
  }
  return false;
}